

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInput.cpp
# Opt level: O1

void __thiscall gr::GrBufferIStream::ReadBlockFromFont(GrBufferIStream *this,void *pvInput,int cb)

{
  undefined4 *puVar1;
  
  if ((this->m_pbLim != (byte *)0x0) &&
     ((cb < 0 || ((long)this->m_pbLim - (long)this->m_pbNext < (long)(ulong)(uint)cb)))) {
    puVar1 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar1 = 0x80000001;
    __cxa_throw(puVar1,&GrResult::typeinfo,0);
  }
  if (cb != 0) {
    memmove(pvInput,this->m_pbNext,(long)cb);
  }
  this->m_pbNext = this->m_pbNext + cb;
  return;
}

Assistant:

void GrBufferIStream::ReadBlockFromFont(void * pvInput, int cb)
{
    if (m_pbLim && (cb < 0 || cb > m_pbLim - m_pbNext))
        THROW(kresReadFault);
	std::copy(m_pbNext, m_pbNext + cb, reinterpret_cast<byte*>(pvInput));
	m_pbNext += cb;
}